

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleIndexVertexMaterialArray.cpp
# Opt level: O0

void __thiscall
btTriangleIndexVertexMaterialArray::btTriangleIndexVertexMaterialArray
          (btTriangleIndexVertexMaterialArray *this,int numTriangles,int *triangleIndexBase,
          int triangleIndexStride,int numVertices,btScalar *vertexBase,int vertexStride,
          int numMaterials,uchar *materialBase,int materialStride,int *triangleMaterialsBase,
          int materialIndexStride)

{
  undefined4 in_ECX;
  btMaterialProperties *in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  btMaterialProperties mat;
  undefined4 in_stack_ffffffffffffff80;
  PHY_ScalarType in_stack_ffffffffffffff84;
  btTriangleIndexVertexMaterialArray *this_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int *in_stack_ffffffffffffffd0;
  int in_stack_fffffffffffffff0;
  
  btTriangleIndexVertexArray::btTriangleIndexVertexArray
            ((btTriangleIndexVertexArray *)CONCAT44(in_ECX,in_R8D),(int)((ulong)in_R9 >> 0x20),
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
             (btScalar *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_fffffffffffffff0);
  *(undefined ***)in_RDI = &PTR__btTriangleIndexVertexMaterialArray_002e5cb8;
  this_00 = (btTriangleIndexVertexMaterialArray *)&in_RDI[2].m_materialBase;
  btAlignedObjectArray<btMaterialProperties>::btAlignedObjectArray
            ((btAlignedObjectArray<btMaterialProperties> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  addMaterialProperties(this_00,in_RDI,in_stack_ffffffffffffff84);
  return;
}

Assistant:

btTriangleIndexVertexMaterialArray::btTriangleIndexVertexMaterialArray(int numTriangles,int* triangleIndexBase,int triangleIndexStride,
                                   int numVertices,btScalar* vertexBase,int vertexStride,
                                   int numMaterials, unsigned char* materialBase, int materialStride,
                                   int* triangleMaterialsBase, int materialIndexStride) :
btTriangleIndexVertexArray(numTriangles, triangleIndexBase, triangleIndexStride, numVertices, vertexBase, vertexStride)
{
    btMaterialProperties mat;

    mat.m_numMaterials = numMaterials;
    mat.m_materialBase = materialBase;
    mat.m_materialStride = materialStride;
#ifdef BT_USE_DOUBLE_PRECISION
    mat.m_materialType = PHY_DOUBLE;
#else
    mat.m_materialType = PHY_FLOAT;
#endif

    mat.m_numTriangles = numTriangles;
    mat.m_triangleMaterialsBase = (unsigned char *)triangleMaterialsBase;
    mat.m_triangleMaterialStride = materialIndexStride;
    mat.m_triangleType = PHY_INTEGER;

    addMaterialProperties(mat);
}